

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseBindVarOpt(WastParser *this,string *name)

{
  bool bVar1;
  allocator<char> local_91;
  string_view local_90;
  string local_80 [32];
  undefined1 local_60 [8];
  Token token;
  string *name_local;
  WastParser *this_local;
  
  token.field_2.literal_.text._M_str = (char *)name;
  bVar1 = PeekMatch(this,Last_String,0);
  if (bVar1) {
    Consume((Token *)local_60,this);
    local_90 = Token::text((Token *)local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_80,&local_90,&local_91);
    std::__cxx11::string::operator=((string *)token.field_2.literal_.text._M_str,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_91);
  }
  return bVar1;
}

Assistant:

bool WastParser::ParseBindVarOpt(std::string* name) {
  WABT_TRACE(ParseBindVarOpt);
  if (!PeekMatch(TokenType::Var)) {
    return false;
  }
  Token token = Consume();
  *name = std::string(token.text());
  return true;
}